

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvccapture2.cpp
# Opt level: O0

bool __thiscall V4L2Device::open_device(V4L2Device *this)

{
  int iVar1;
  char *__file;
  int *piVar2;
  int *in_RDI;
  char *device;
  undefined4 uVar3;
  undefined2 in_stack_fffffffffffffe5c;
  DispatchAction in_stack_fffffffffffffe5e;
  Writer *in_stack_fffffffffffffe60;
  Writer *pWVar4;
  LineNumber in_stack_fffffffffffffe68;
  char *in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  Level level;
  Writer *in_stack_fffffffffffffe80;
  string *in_stack_fffffffffffffe88;
  VerboseLevel verboseLevel;
  Options *in_stack_fffffffffffffe90;
  Writer local_138;
  char *local_c8;
  Writer local_c0;
  allocator local_39;
  string local_38 [24];
  bool local_1;
  
  level = (Level)((ulong)in_stack_fffffffffffffe78 >> 0x30);
  if (*in_RDI == -1) {
    std::__shared_ptr_access<cxxopts::Options,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<cxxopts::Options,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffe60);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"device",&local_39);
    cxxopts::Options::operator[](in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    verboseLevel = (VerboseLevel)in_stack_fffffffffffffe90;
    cxxopts::OptionDetails::as<std::__cxx11::string>((OptionDetails *)in_stack_fffffffffffffe60);
    __file = (char *)std::__cxx11::string::c_str();
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    iVar1 = open(__file,2);
    *in_RDI = iVar1;
    if (*in_RDI < 0) {
      uVar3 = 0;
      pWVar4 = &local_c0;
      el::base::Writer::Writer
                (in_stack_fffffffffffffe80,level,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68
                 ,(char *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5e,verboseLevel);
      el::base::Writer::construct(pWVar4,1,el::base::consts::kDefaultLoggerId);
      el::base::Writer::operator<<
                (in_stack_fffffffffffffe60,
                 (char (*) [16])
                 CONCAT26(in_stack_fffffffffffffe5e,CONCAT24(in_stack_fffffffffffffe5c,uVar3)));
      el::base::Writer::operator<<
                (in_stack_fffffffffffffe60,
                 (char **)CONCAT26(in_stack_fffffffffffffe5e,
                                   CONCAT24(in_stack_fffffffffffffe5c,uVar3)));
      el::base::Writer::operator<<
                (in_stack_fffffffffffffe60,
                 (char (*) [4])
                 CONCAT26(in_stack_fffffffffffffe5e,CONCAT24(in_stack_fffffffffffffe5c,uVar3)));
      piVar2 = __errno_location();
      local_c8 = strerror(*piVar2);
      el::base::Writer::operator<<
                (in_stack_fffffffffffffe60,
                 (char **)CONCAT26(in_stack_fffffffffffffe5e,
                                   CONCAT24(in_stack_fffffffffffffe5c,uVar3)));
      el::base::Writer::~Writer(in_stack_fffffffffffffe60);
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    uVar3 = 0;
    pWVar4 = &local_138;
    el::base::Writer::Writer
              (in_stack_fffffffffffffe80,level,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
               (char *)pWVar4,in_stack_fffffffffffffe5e,(VerboseLevel)in_stack_fffffffffffffe90);
    el::base::Writer::construct(pWVar4,1,el::base::consts::kDefaultLoggerId);
    el::base::Writer::operator<<
              (pWVar4,(char (*) [31])
                      CONCAT26(in_stack_fffffffffffffe5e,CONCAT24(in_stack_fffffffffffffe5c,uVar3)))
    ;
    el::base::Writer::~Writer(pWVar4);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool
    open_device()
    {
        if (fd == -1) {
            auto device = (*options)["device"].as<std::string>().c_str();
            fd = open(device, O_RDWR);
            if (fd < 0) {
                LOG(ERROR) << "Couldn't open '" << device << "': " << strerror(errno);
                return false;
            }
        } else {
            LOG(WARNING) << "Is device already initialized?";
            return false;
        }

        return true;
    }